

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O0

void __thiscall ans_byte_decode::ans_byte_decode(ans_byte_decode *this)

{
  void *in_RDI;
  
  memset(in_RDI,0,0x400);
  std::vector<dec_entry,_std::allocator<dec_entry>_>::vector
            ((vector<dec_entry,_std::allocator<dec_entry>_> *)0x18d8a0);
  return;
}

Assistant:

static ans_byte_decode load(const uint8_t* in_u8)
    {
        ans_byte_decode model;
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
        std::array<uint32_t, constants::MAX_SIGMA> efreqs;
        interpolative_internal::decode(in_ptr_u32, model.nfreqs.data(),
            constants::MAX_SIGMA,
            constants::MAX_FRAME_SIZE + constants::MAX_SIGMA);
        uint32_t prev = model.nfreqs[0];
        for (size_t sym = 1; sym < constants::MAX_SIGMA; sym++) {
            auto cur = model.nfreqs[sym];
            model.nfreqs[sym] = cur - prev - 1;
            prev = cur;
        }
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0ULL);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        uint64_t tmp = constants::K * constants::RADIX;
        uint16_t cur_base = 0;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint16_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].sym = sym;
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }